

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void mouse_handling::onMouseMove(GLFWwindow *window,double x,double y)

{
  float fVar1;
  float fVar2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar3;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  int windowH;
  int windowW;
  int local_6c;
  int local_68;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  float local_38;
  float local_28;
  float local_18;
  
  uStack_44 = (uint)((ulong)x >> 0x20);
  if ((pressed == '\0') && (middlePressed == '\0')) {
    local_5c = (float)x;
    local_60 = (float)y;
  }
  else {
    local_5c = (float)x;
    local_48 = local_5c - prevX;
    local_60 = (float)y;
    local_58 = ZEXT416((uint)(local_60 - prevY));
    uStack_40 = in_XMM0_Dc;
    uStack_3c = in_XMM0_Dd;
    glfwGetWindowSize(window,&local_68,&local_6c);
    if (pressed == '\x01') {
      for (orbitCam.heading = (local_48 * -3.1415927) / (float)local_68 + orbitCam.heading;
          orbitCam.heading < 0.0; orbitCam.heading = orbitCam.heading + 6.2831855) {
      }
      for (; 6.2831855 < orbitCam.heading; orbitCam.heading = orbitCam.heading + -6.2831855) {
      }
      fVar1 = ((float)local_58._0_4_ * -3.1415927) / (float)local_6c + orbitCam.pitch;
      fVar2 = -1.4137167;
      if (-1.4137167 <= fVar1) {
        fVar2 = fVar1;
      }
      orbitCam.pitch = 1.4137167;
      if (fVar2 <= 1.4137167) {
        orbitCam.pitch = fVar2;
      }
    }
    if (middlePressed == '\x01') {
      uStack_44 = uStack_44 ^ 0x80000000;
      uStack_40 = uStack_40 ^ 0x80000000;
      uStack_3c = uStack_3c ^ 0x80000000;
      local_48 = -local_48 / (float)local_68;
      local_64 = orbitCam.distance;
      local_58._0_4_ = (float)local_58._0_4_ / (float)local_6c;
      local_18 = cosf(orbitCam.pitch);
      local_38 = sinf(orbitCam.pitch);
      local_28 = cosf(orbitCam.heading);
      fVar2 = sinf(orbitCam.heading);
      local_48 = local_48 * local_64;
      fVar1 = (float)local_58._0_4_ * local_64;
      local_64 = local_64 * 0.0;
      aVar3 = orbitCam.center.field_0;
      orbitCam.center.field_1.y =
           orbitCam.center.field_1.y +
           local_64 * -local_38 * local_28 + local_48 * local_38 * fVar2 + local_18 * fVar1;
      orbitCam.center.field_0.x = aVar3.x + local_64 * fVar2 + local_48 * local_28 + fVar1 * 0.0;
      orbitCam.center.field_2.z =
           local_18 * local_28 * local_64 + (local_38 * fVar1 - local_18 * fVar2 * local_48) +
           orbitCam.center.field_2.z;
    }
  }
  prevX = local_5c;
  prevY = local_60;
  return;
}

Assistant:

void onMouseMove(GLFWwindow* window, double x, double y)
    {
        if(selectedCamera == -1) // orbit camera is active
        if(pressed || middlePressed)
        {
            const float dx = (float)x - prevX;
            const float dy = (float)y - prevY;
            int windowW, windowH;
            glfwGetWindowSize(window, &windowW, &windowH);
            if(pressed)
            {
                constexpr float speed = PI;
                orbitCam.heading -= speed * dx / windowW;
                while(orbitCam.heading < 0)
                    orbitCam.heading += 2*PI;
                while(orbitCam.heading > 2*PI)
                    orbitCam.heading -= 2*PI;
                orbitCam.pitch -= speed * dy / windowH;
                orbitCam.pitch = glm::clamp(orbitCam.pitch, -0.45f*PI, +0.45f*PI);
            }
            if(middlePressed)
            {
                // center panning
                float speed = orbitCam.distance;
                const vec3 v2d = {-dx/windowW, dy/windowH, 0};
                const glm::mat3 rot = glm::eulerAngleXY(orbitCam.pitch, orbitCam.heading);
                orbitCam.center += rot * (speed * v2d);
            }
        }
        prevX = (float)x;
        prevY = (float)y;
    }